

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O3

pint p_error_get_last_net(void)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  return *piVar1;
}

Assistant:

P_LIB_API pint
p_error_get_last_net (void)
{
#if defined (P_OS_WIN)
	return WSAGetLastError ();
#elif defined (P_OS_OS2)
	return sock_errno ();
#else
	return p_error_get_last_system ();
#endif
}